

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double chi_cdf_inv(double cdf,double a,double b,double c)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if ((cdf < 0.0) || (1.0 < cdf)) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"CHI_CDF_INV - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
    exit(1);
  }
  if ((cdf != 0.0) || (NAN(cdf))) {
    if ((cdf != 1.0) || (NAN(cdf))) {
      dVar4 = a + 1.0;
      while( true ) {
        dVar2 = 0.0;
        dVar3 = dVar4 - a;
        if (a < dVar4) {
          dVar2 = r8_gamma_inc(c * 0.5,(dVar3 / b) * 0.5 * (dVar3 / b));
        }
        if (cdf < dVar2) break;
        dVar4 = dVar3 + dVar3 + a;
      }
      iVar1 = 0;
      dVar2 = a;
      dVar3 = 0.0;
      while( true ) {
        dVar5 = dVar3;
        dVar6 = dVar2;
        iVar1 = iVar1 + 1;
        dVar2 = (dVar6 + dVar4) * 0.5;
        dVar3 = 0.0;
        if (a < dVar2) {
          dVar3 = (dVar2 - a) / b;
          dVar3 = r8_gamma_inc(c * 0.5,dVar3 * 0.5 * dVar3);
        }
        if (ABS(dVar3 - cdf) < 0.0001) {
          return dVar2;
        }
        if (iVar1 == 0x65) break;
        if ((cdf < dVar5 || cdf < dVar3) && (dVar3 < cdf || dVar5 < cdf)) {
          dVar4 = dVar2;
          dVar2 = dVar6;
          dVar3 = dVar5;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"CHI_CDF_INV - Fatal error!\n",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"  Iteration limit exceeded.\n",0x1c);
      a = 0.0;
    }
    else {
      a = 1e+30;
    }
  }
  return a;
}

Assistant:

double chi_cdf_inv ( double cdf, double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_CDF_INV inverts the Chi CDF.
//
//  Discussion:
//
//    A simple bisection method is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//
//    Input, double A, B, C, the parameters of the PDF.
//    0 < B,
//    0 < C.
//
//    Output, double CHI_CDF_INV, the corresponding argument of the CDF.
//
{
  double cdf1;
  double cdf2;
  double cdf3;
  int it;
  int it_max = 100;
  const double r8_huge = 1.0E+30;
  double tol = 0.0001;
  double x;
  double x1;
  double x2;
  double x3;

  x = 0.0;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "CHI_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( cdf == 0.0 )
  {
    x = a;
    return x;
  }
  else if ( 1.0 == cdf )
  {
    x = r8_huge;
    return x;
  }

  x1 = a;
  cdf1 = 0.0;

  x2 = a + 1.0;

  for ( ; ; )
  {
    cdf2 = chi_cdf ( x2, a, b, c );

    if ( cdf < cdf2 )
    {
      break;
    }

    x2 = a + 2.0 * ( x2 - a );
  }
//
//  Now use bisection.
//
  it = 0;

  for ( ; ; )
  {
    it = it + 1;

    x3 = 0.5 * ( x1 + x2 );
    cdf3 = chi_cdf ( x3, a, b, c );

    if ( fabs ( cdf3 - cdf ) < tol )
    {
      x = x3;
      break;
    }

    if ( it_max < it )
    {
      cerr << " \n";
      cerr << "CHI_CDF_INV - Fatal error!\n";
      cerr << "  Iteration limit exceeded.\n";
      return x;
    }

    if ( ( cdf3 <= cdf && cdf1 <= cdf ) || ( cdf <= cdf3 && cdf <= cdf1 ) )
    {
      x1 = x3;
      cdf1 = cdf3;
    }
    else
    {
      x2 = x3;
      cdf2 = cdf3;
    }

  }

  return x;
}